

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O3

void player_leaving(loc grid1,loc grid2)

{
  _Bool _Var1;
  wchar_t wVar2;
  loc grid;
  
  grid = cave_find_decoy(cave);
  _Var1 = loc_is_zero((loc_conflict)grid);
  if (!_Var1) {
    wVar2 = distance((loc_conflict)grid,(loc_conflict)grid2);
    if ((int)(uint)z_info->max_sight < wVar2) {
      square_destroy_decoy(cave,grid);
    }
  }
  hit_trap(grid1,L'\x01');
  return;
}

Assistant:

static void player_leaving(struct loc grid1, struct loc grid2)
{
	struct loc decoy = cave_find_decoy(cave);

	/* Decoys get destroyed if player is too far away */
	if (!loc_is_zero(decoy) &&
		distance(decoy, grid2) > z_info->max_sight) {
		square_destroy_decoy(cave, decoy);
	}

	/* Delayed traps trigger when the player leaves. */
	hit_trap(grid1, 1);
}